

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O2

Link * __thiscall
DistanceGraph::get_link
          (Link *__return_storage_ptr__,DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  pointer pvVar1;
  pointer pLVar2;
  sgNodeID_t sVar3;
  int32_t iVar4;
  undefined4 uVar5;
  SupportType SVar6;
  undefined1 uVar7;
  uint16_t uVar8;
  undefined4 uVar9;
  pointer pLVar10;
  long lVar11;
  
  lVar11 = -source;
  if (0 < source) {
    lVar11 = source;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar10 = pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar2 = *(pointer *)
            ((long)&pvVar1[lVar11].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data + 8);
  do {
    if (pLVar10 == pLVar2) {
      __return_storage_ptr__->dist = 0;
      __return_storage_ptr__->source = 0;
      __return_storage_ptr__->dest = 0;
      (__return_storage_ptr__->support).type = Undefined;
      (__return_storage_ptr__->support).field_0x1 = 0;
      (__return_storage_ptr__->support).index = 0;
      *(undefined4 *)&(__return_storage_ptr__->support).field_0x4 = 0;
      (__return_storage_ptr__->support).id = 0;
      return __return_storage_ptr__;
    }
    sVar3 = pLVar10->dest;
    iVar4 = pLVar10->dist;
    uVar5 = *(undefined4 *)&pLVar10->field_0x14;
    SVar6 = (pLVar10->support).type;
    uVar7 = (pLVar10->support).field_0x1;
    uVar8 = (pLVar10->support).index;
    uVar9 = *(undefined4 *)&(pLVar10->support).field_0x4;
    __return_storage_ptr__->source = pLVar10->source;
    __return_storage_ptr__->dest = sVar3;
    (__return_storage_ptr__->support).id = (pLVar10->support).id;
    __return_storage_ptr__->dist = iVar4;
    *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar5;
    (__return_storage_ptr__->support).type = SVar6;
    (__return_storage_ptr__->support).field_0x1 = uVar7;
    (__return_storage_ptr__->support).index = uVar8;
    *(undefined4 *)&(__return_storage_ptr__->support).field_0x4 = uVar9;
    pLVar10 = pLVar10 + 1;
  } while (__return_storage_ptr__->dest != dest);
  return __return_storage_ptr__;
}

Assistant:

Link DistanceGraph::get_link(sgNodeID_t source, sgNodeID_t dest) {
    for (auto l:links[(source > 0 ? source : -source)]) {
        if (l.source==source,l.dest==dest) return l;
    }
    return Link(0,0,0);
}